

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_proxy_io.c
# Opt level: O3

int http_proxy_io_set_option(CONCRETE_IO_HANDLE http_proxy_io,char *option_name,void *value)

{
  int iVar1;
  OPTIONHANDLER_RESULT OVar2;
  LOGGER_LOG p_Var3;
  int iVar4;
  char *pcVar5;
  
  if (http_proxy_io == (CONCRETE_IO_HANDLE)0x0 || option_name == (char *)0x0) {
    p_Var3 = xlogging_get_log_function();
    iVar1 = 0x397;
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return 0x397;
    }
    pcVar5 = "Bad arguments: http_proxy_io = %p, option_name = %p";
    iVar4 = 0x396;
LAB_0010a347:
    (*p_Var3)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/src/http_proxy_io.c"
              ,"http_proxy_io_set_option",iVar4,1,pcVar5,http_proxy_io);
  }
  else {
    iVar1 = strcmp(option_name,"underlying_io_options");
    if (iVar1 == 0) {
      OVar2 = OptionHandler_FeedOptions
                        ((OPTIONHANDLER_HANDLE)value,*(XIO_HANDLE *)((long)http_proxy_io + 0x78));
      if (OVar2 != OPTIONHANDLER_OK) {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 == (LOGGER_LOG)0x0) {
          return 0x3a4;
        }
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/src/http_proxy_io.c"
                  ,"http_proxy_io_set_option",0x3a3,1,
                  "failed feeding options to underlying I/O instance");
        return 0x3a4;
      }
    }
    else {
      iVar1 = xio_setoption(*(XIO_HANDLE *)((long)http_proxy_io + 0x78),option_name,value);
      if (iVar1 != 0) {
        p_Var3 = xlogging_get_log_function();
        iVar1 = 0x3b1;
        if (p_Var3 == (LOGGER_LOG)0x0) {
          return 0x3b1;
        }
        pcVar5 = "Unrecognized option %s";
        iVar4 = 0x3b0;
        http_proxy_io = option_name;
        goto LAB_0010a347;
      }
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int http_proxy_io_set_option(CONCRETE_IO_HANDLE http_proxy_io, const char* option_name, const void* value)
{
    int result;

    if ((http_proxy_io == NULL) || (option_name == NULL))
    {
        /* Codes_SRS_HTTP_PROXY_IO_01_040: [ If any of the arguments http_proxy_io or option_name is NULL, http_proxy_io_set_option shall return a non-zero value. ]*/
        LogError("Bad arguments: http_proxy_io = %p, option_name = %p",
            http_proxy_io, option_name);
        result = MU_FAILURE;
    }
    else
    {
        HTTP_PROXY_IO_INSTANCE* http_proxy_io_instance = (HTTP_PROXY_IO_INSTANCE*)http_proxy_io;

        /* Codes_SRS_HTTP_PROXY_IO_01_045: [ None. ]*/

        if (strcmp(option_name, OPTION_UNDERLYING_IO_OPTIONS) == 0)
        {
            if (OptionHandler_FeedOptions((OPTIONHANDLER_HANDLE)value, (void*)http_proxy_io_instance->underlying_io) != OPTIONHANDLER_OK)
            {
                LogError("failed feeding options to underlying I/O instance");
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }
        }
        /* Codes_SRS_HTTP_PROXY_IO_01_043: [ If the option_name argument indicates an option that is not handled by http_proxy_io_set_option, then xio_setoption shall be called on the underlying IO created in http_proxy_io_create, passing the option name and value to it. ]*/
        /* Codes_SRS_HTTP_PROXY_IO_01_056: [ The value argument shall be allowed to be NULL. ]*/
        else if (xio_setoption(http_proxy_io_instance->underlying_io, option_name, value) != 0)
        {
            /* Codes_SRS_HTTP_PROXY_IO_01_044: [ if xio_setoption fails, http_proxy_io_set_option shall return a non-zero value. ]*/
            LogError("Unrecognized option %s", option_name);
            result = MU_FAILURE;
        }
        else
        {
            /* Codes_SRS_HTTP_PROXY_IO_01_042: [ If the option was handled by http_proxy_io_set_option or the underlying IO, then http_proxy_io_set_option shall return 0. ]*/
            result = 0;
        }
    }

    return result;
}